

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

void tcu::fillWithGrid(PixelBufferAccess *access,int cellSize,Vec4 *colorA,Vec4 *colorB)

{
  bool bVar1;
  int iVar2;
  TextureFormat *pTVar3;
  bool local_a2;
  bool local_a1;
  Vector<float,_4> local_a0;
  Vector<float,_4> local_90;
  PixelBufferAccess local_80;
  PixelBufferAccess local_58;
  bool local_2a;
  bool local_29;
  bool hasStencil;
  Vec4 *pVStack_28;
  bool hasDepth;
  Vec4 *colorB_local;
  Vec4 *colorA_local;
  ConstPixelBufferAccess *pCStack_10;
  int cellSize_local;
  PixelBufferAccess *access_local;
  
  pVStack_28 = colorB;
  colorB_local = colorA;
  colorA_local._4_4_ = cellSize;
  pCStack_10 = &access->super_ConstPixelBufferAccess;
  pTVar3 = ConstPixelBufferAccess::getFormat(&access->super_ConstPixelBufferAccess);
  bVar1 = isCombinedDepthStencilType(pTVar3->type);
  if (bVar1) {
    pTVar3 = ConstPixelBufferAccess::getFormat(pCStack_10);
    local_a1 = true;
    if (pTVar3->order != DS) {
      pTVar3 = ConstPixelBufferAccess::getFormat(pCStack_10);
      local_a1 = pTVar3->order == D;
    }
    local_29 = local_a1;
    pTVar3 = ConstPixelBufferAccess::getFormat(pCStack_10);
    local_a2 = true;
    if (pTVar3->order != DS) {
      pTVar3 = ConstPixelBufferAccess::getFormat(pCStack_10);
      local_a2 = pTVar3->order == S;
    }
    local_2a = local_a2;
    if ((local_29 & 1U) != 0) {
      getEffectiveDepthStencilAccess(&local_58,(PixelBufferAccess *)pCStack_10,MODE_DEPTH);
      fillWithGrid(&local_58,colorA_local._4_4_,colorB_local,pVStack_28);
    }
    if ((local_2a & 1U) != 0) {
      getEffectiveDepthStencilAccess(&local_80,(PixelBufferAccess *)pCStack_10,MODE_STENCIL);
      iVar2 = colorA_local._4_4_;
      Vector<float,_4>::swizzle(&local_90,(int)colorB_local,3,2,1);
      Vector<float,_4>::swizzle(&local_a0,(int)pVStack_28,3,2,1);
      fillWithGrid(&local_80,iVar2,&local_90,&local_a0);
    }
  }
  else {
    iVar2 = ConstPixelBufferAccess::getHeight(pCStack_10);
    if ((iVar2 == 1) && (iVar2 = ConstPixelBufferAccess::getDepth(pCStack_10), iVar2 == 1)) {
      fillWithGrid1D((PixelBufferAccess *)pCStack_10,colorA_local._4_4_,colorB_local,pVStack_28);
    }
    else {
      iVar2 = ConstPixelBufferAccess::getDepth(pCStack_10);
      if (iVar2 == 1) {
        fillWithGrid2D((PixelBufferAccess *)pCStack_10,colorA_local._4_4_,colorB_local,pVStack_28);
      }
      else {
        fillWithGrid3D((PixelBufferAccess *)pCStack_10,colorA_local._4_4_,colorB_local,pVStack_28);
      }
    }
  }
  return;
}

Assistant:

void fillWithGrid (const PixelBufferAccess& access, int cellSize, const Vec4& colorA, const Vec4& colorB)
{
	if (isCombinedDepthStencilType(access.getFormat().type))
	{
		const bool hasDepth		= access.getFormat().order == tcu::TextureFormat::DS || access.getFormat().order == tcu::TextureFormat::D;
		const bool hasStencil	= access.getFormat().order == tcu::TextureFormat::DS || access.getFormat().order == tcu::TextureFormat::S;

		DE_ASSERT(hasDepth || hasStencil);

		// For combined formats, treat D and S as separate channels
		if (hasDepth)
			fillWithGrid(getEffectiveDepthStencilAccess(access, tcu::Sampler::MODE_DEPTH), cellSize, colorA, colorB);
		if (hasStencil)
			fillWithGrid(getEffectiveDepthStencilAccess(access, tcu::Sampler::MODE_STENCIL), cellSize, colorA.swizzle(3,2,1,0), colorB.swizzle(3,2,1,0));
	}
	else
	{
		if (access.getHeight() == 1 && access.getDepth() == 1)
			fillWithGrid1D(access, cellSize, colorA, colorB);
		else if (access.getDepth() == 1)
			fillWithGrid2D(access, cellSize, colorA, colorB);
		else
			fillWithGrid3D(access, cellSize, colorA, colorB);
	}
}